

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.cc
# Opt level: O3

bool xt::seq::contains(Seq *s,Object *o)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  double local_28;
  
  peVar1 = (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  do {
    if (peVar1 == (element_type *)0x0) {
      return false;
    }
    (**peVar1->_vptr_ISeq)(&local_38);
    if (((Type)local_38 == o->type) &&
       (p_Stack_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)o->typeinfo)) {
      if ((local_28 == (o->field_2).number) && (!NAN(local_28) && !NAN((o->field_2).number))) {
        return true;
      }
    }
    (*((s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ISeq[1])
              (&local_38);
    p_Var2 = p_Stack_30;
    peVar1 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
    this = (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var2;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
      peVar1 = (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
  } while( true );
}

Assistant:

bool contains(Seq s, Object o) {
	while (s) {
		if (s->first() == o) return true;
		s = s->next();
	}
	return false;
}